

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void absl::lts_20250127::container_internal::
     btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
     ::clear_and_delete(btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
                        *node,allocator_type *alloc)

{
  bool bVar1;
  field_type fVar2;
  field_type fVar3;
  byte bVar4;
  byte bVar5;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *pbVar6;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *this;
  btree_node<absl::lts_20250127::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>,_256,_false>_>
  *pbVar7;
  ulong uVar8;
  ulong uVar9;
  
  bVar1 = is_leaf(node);
  if (bVar1) {
    fVar2 = start(node);
    fVar3 = count(node);
    value_destroy_n(node,fVar2,fVar3,alloc);
    bVar4 = max_count(node);
    Deallocate<8ul,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
              (alloc,node,(ulong)((uint)bVar4 * 0x28 + 0x10));
    return;
  }
  fVar2 = count(node);
  if (fVar2 == '\0') {
    operator_delete(node,0x138);
    return;
  }
  pbVar6 = parent(node);
  while (bVar1 = is_internal(node), bVar1) {
    node = start_child(node);
  }
  bVar4 = position(node);
  uVar8 = (ulong)bVar4;
  this = parent(node);
  while( true ) {
    bVar4 = finish(this);
    if (bVar4 < uVar8) {
      __assert_fail("pos <= parent->finish()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                    ,0x7ef,
                    "static void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>>::clear_and_delete(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>]"
                   );
    }
    do {
      pbVar7 = child(this,(field_type)uVar8);
      bVar1 = is_internal(pbVar7);
      uVar9 = uVar8;
      if (bVar1) {
        while (bVar1 = is_internal(pbVar7), bVar1) {
          pbVar7 = start_child(pbVar7);
        }
        bVar4 = position(pbVar7);
        this = parent(pbVar7);
        uVar9 = (ulong)bVar4;
      }
      fVar2 = start(pbVar7);
      fVar3 = count(pbVar7);
      value_destroy_n(pbVar7,fVar2,fVar3,alloc);
      bVar4 = max_count(pbVar7);
      Deallocate<8ul,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>>
                (alloc,pbVar7,(ulong)((uint)bVar4 * 0x28 + 0x10));
      uVar8 = uVar9 + 1;
      bVar4 = finish(this);
    } while (uVar9 < bVar4);
    bVar4 = finish(this);
    pbVar7 = this;
    if (uVar9 < bVar4) break;
    do {
      bVar4 = position(pbVar7);
      this = parent(pbVar7);
      fVar2 = start(pbVar7);
      fVar3 = count(pbVar7);
      value_destroy_n(pbVar7,fVar2,fVar3,alloc);
      operator_delete(pbVar7,0x138);
      if (this == pbVar6) {
        return;
      }
      bVar5 = finish(this);
      pbVar7 = this;
    } while (bVar5 <= bVar4);
    uVar8 = (ulong)bVar4 + 1;
  }
  __assert_fail("pos > parent->finish()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/btree.h"
                ,0x801,
                "static void absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>>::clear_and_delete(btree_node<Params> *, allocator_type *) [Params = absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolEntry>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::clear_and_delete(btree_node *node, allocator_type *alloc) {
  if (node->is_leaf()) {
    node->value_destroy_n(node->start(), node->count(), alloc);
    deallocate(LeafSize(node->max_count()), node, alloc);
    return;
  }
  if (node->count() == 0) {
    deallocate(InternalSize(), node, alloc);
    return;
  }

  // The parent of the root of the subtree we are deleting.
  btree_node *delete_root_parent = node->parent();

  // Navigate to the leftmost leaf under node, and then delete upwards.
  while (node->is_internal()) node = node->start_child();
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
  // When generations are enabled, we delete the leftmost leaf last in case it's
  // the parent of the root and we need to check whether it's a leaf before we
  // can update the root's generation.
  // TODO(ezb): if we change btree_node::is_root to check a bool inside the node
  // instead of checking whether the parent is a leaf, we can remove this logic.
  btree_node *leftmost_leaf = node;
#endif
  // Use `size_type` because `pos` needs to be able to hold `kNodeSlots+1`,
  // which isn't guaranteed to be a valid `field_type`.
  size_type pos = node->position();
  btree_node *parent = node->parent();
  for (;;) {
    // In each iteration of the next loop, we delete one leaf node and go right.
    assert(pos <= parent->finish());
    do {
      node = parent->child(static_cast<field_type>(pos));
      if (node->is_internal()) {
        // Navigate to the leftmost leaf under node.
        while (node->is_internal()) node = node->start_child();
        pos = node->position();
        parent = node->parent();
      }
      node->value_destroy_n(node->start(), node->count(), alloc);
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
      if (leftmost_leaf != node)
#endif
        deallocate(LeafSize(node->max_count()), node, alloc);
      ++pos;
    } while (pos <= parent->finish());

    // Once we've deleted all children of parent, delete parent and go up/right.
    assert(pos > parent->finish());
    do {
      node = parent;
      pos = node->position();
      parent = node->parent();
      node->value_destroy_n(node->start(), node->count(), alloc);
      deallocate(InternalSize(), node, alloc);
      if (parent == delete_root_parent) {
#ifdef ABSL_BTREE_ENABLE_GENERATIONS
        deallocate(LeafSize(leftmost_leaf->max_count()), leftmost_leaf, alloc);
#endif
        return;
      }
      ++pos;
    } while (pos > parent->finish());
  }
}